

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double xi,
          double eta)

{
  bool bVar1;
  ChVector<double> *v;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  ChVector<double> r_zeta;
  VectorN Sxi_zeta_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_3a8;
  VectorN *local_3a0;
  ChVector<double> local_398;
  VectorN local_380;
  Matrix3xN local_2c0;
  
  Calc_Sxi_zeta_compact(this,&local_380,xi,eta,0.0,this->m_thicknessZ,this->m_midsurfoffset);
  CalcCoordMatrix(this,&local_2c0);
  local_3a8 = &local_2c0;
  local_3a0 = &local_380;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,1,0,24,1>,0>>
            (&local_398,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0>_>
              *)&local_3a8,(type *)0x0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_398.m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_398.m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_398.m_data[1] * local_398.m_data[1];
  auVar2 = vfmadd231sd_fma(auVar5,auVar2,auVar2);
  auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar3);
  auVar2 = vsqrtsd_avx(auVar2,auVar2);
  bVar1 = 2.2250738585072014e-308 <= auVar2._0_8_;
  dVar4 = 1.0 / auVar2._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar1 * (long)(local_398.m_data[0] * dVar4) +
               (ulong)!bVar1 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar1 * (long)(local_398.m_data[1] * dVar4));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar1 * (long)(local_398.m_data[2] * dVar4));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellANCF_3833::ComputeNormal(const double xi, const double eta) {
    VectorN Sxi_zeta_compact;
    Calc_Sxi_zeta_compact(Sxi_zeta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the position vector gradient with respect to zeta at the current point (whose length may not equal 1)
    ChVector<> r_zeta = e_bar * Sxi_zeta_compact;

    return r_zeta.GetNormalized();
}